

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss.c
# Opt level: O0

void test_time_detection(void)

{
  int iVar1;
  quicly_loss_t loss;
  uint16_t in_stack_ffffffffffffff6e;
  quicly_sentmap_t *in_stack_ffffffffffffff70;
  uint8_t in_stack_ffffffffffffff87;
  int64_t in_stack_ffffffffffffff88;
  size_t in_stack_ffffffffffffff90;
  quicly_sentmap_t *in_stack_ffffffffffffff98;
  quicly_loss_t *in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa8;
  uint32_t in_stack_ffffffffffffffac;
  int64_t in_stack_ffffffffffffffb0;
  quicly_loss_t *in_stack_ffffffffffffffb8;
  quicly_loss_t *pqVar2;
  
  now = 0;
  num_packets_lost = 0;
  quicly_loss_init((quicly_loss_t *)loss.time_of_last_packet_sent,(quicly_loss_conf_t *)loss._24_8_,
                   loss.ack_delay_exponent._4_4_,loss.max_ack_delay,(uint8_t *)loss.conf);
  _ok((int)(ulong)(in_stack_ffffffffffffffb8 == (quicly_loss_t *)0x7fffffffffffffff),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/loss.c",0x3b);
  iVar1 = quicly_sentmap_prepare
                    (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                     in_stack_ffffffffffffff87);
  _ok((int)(ulong)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/loss.c",0x3e);
  quicly_sentmap_commit(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6e);
  iVar1 = quicly_sentmap_prepare
                    (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                     in_stack_ffffffffffffff87);
  _ok((int)(ulong)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/loss.c",0x40);
  quicly_sentmap_commit(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6e);
  iVar1 = quicly_sentmap_prepare
                    (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                     in_stack_ffffffffffffff87);
  _ok((int)(ulong)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/loss.c",0x42);
  quicly_sentmap_commit(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6e);
  iVar1 = quicly_loss_detect_loss
                    (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
                     in_stack_ffffffffffffffa8,(quicly_loss_on_detect_cb)in_stack_ffffffffffffffa0);
  _ok((int)(ulong)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/loss.c",0x44);
  _ok((int)(ulong)(in_stack_ffffffffffffffb8 == (quicly_loss_t *)0x7fffffffffffffff),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/loss.c",0x45);
  now = now + 10;
  acked(in_stack_ffffffffffffffa0,(uint64_t)in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  iVar1 = quicly_loss_detect_loss
                    (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
                     in_stack_ffffffffffffffa8,(quicly_loss_on_detect_cb)in_stack_ffffffffffffffa0);
  _ok((int)(ulong)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/loss.c",0x4b);
  _ok((int)(ulong)(in_stack_ffffffffffffffb8 == (quicly_loss_t *)0x7fffffffffffffff),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/loss.c",0x4c);
  now = now + 10;
  acked(in_stack_ffffffffffffffa0,(uint64_t)in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  iVar1 = quicly_loss_detect_loss
                    (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
                     in_stack_ffffffffffffffa8,(quicly_loss_on_detect_cb)in_stack_ffffffffffffffa0);
  _ok((int)(ulong)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/loss.c",0x52);
  _ok((int)(ulong)(in_stack_ffffffffffffffb8 != (quicly_loss_t *)0x7fffffffffffffff),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/loss.c",0x53);
  pqVar2 = in_stack_ffffffffffffffb8;
  _ok((int)(ulong)(num_packets_lost == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/loss.c",0x54);
  now = (int64_t)pqVar2;
  pqVar2 = (quicly_loss_t *)now;
  iVar1 = quicly_loss_detect_loss
                    ((quicly_loss_t *)now,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
                     in_stack_ffffffffffffffa8,(quicly_loss_on_detect_cb)in_stack_ffffffffffffffa0);
  _ok((int)(ulong)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/loss.c",0x57);
  _ok((int)(ulong)(pqVar2 == (quicly_loss_t *)0x7fffffffffffffff),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/loss.c",0x58);
  _ok((int)(ulong)(num_packets_lost == 1),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/loss.c",0x59);
  quicly_loss_dispose((quicly_loss_t *)0x12e5b7);
  return;
}

Assistant:

static void test_time_detection(void)
{
    quicly_loss_t loss;

    now = 0;
    num_packets_lost = 0;

    quicly_loss_init(&loss, &quicly_spec_context.loss, 20, &quicly_spec_context.transport_params.max_ack_delay,
                     &quicly_spec_context.transport_params.ack_delay_exponent);
    ok(loss.loss_time == INT64_MAX);

    /* commit 3 packets (pn=0..2); check that loss timer is not active */
    ok(quicly_sentmap_prepare(&loss.sentmap, 0, now, QUICLY_EPOCH_INITIAL) == 0);
    quicly_sentmap_commit(&loss.sentmap, 10);
    ok(quicly_sentmap_prepare(&loss.sentmap, 1, now, QUICLY_EPOCH_INITIAL) == 0);
    quicly_sentmap_commit(&loss.sentmap, 10);
    ok(quicly_sentmap_prepare(&loss.sentmap, 2, now, QUICLY_EPOCH_INITIAL) == 0);
    quicly_sentmap_commit(&loss.sentmap, 10);
    ok(quicly_loss_detect_loss(&loss, now, quicly_spec_context.transport_params.max_ack_delay, 0, on_loss_detected) == 0);
    ok(loss.loss_time == INT64_MAX);

    now += 10;

    /* receive ack for the 1st packet; check that loss timer is not active */
    acked(&loss, 0, QUICLY_EPOCH_INITIAL);
    ok(quicly_loss_detect_loss(&loss, now, quicly_spec_context.transport_params.max_ack_delay, 0, on_loss_detected) == 0);
    ok(loss.loss_time == INT64_MAX);

    now += 10;

    /* receive ack for the 3rd packet; check that loss timer is active */
    acked(&loss, 2, QUICLY_EPOCH_INITIAL);
    ok(quicly_loss_detect_loss(&loss, now, quicly_spec_context.transport_params.max_ack_delay, 0, on_loss_detected) == 0);
    ok(loss.loss_time != INT64_MAX);
    ok(num_packets_lost == 0);

    now = loss.loss_time;
    ok(quicly_loss_detect_loss(&loss, now, quicly_spec_context.transport_params.max_ack_delay, 0, on_loss_detected) == 0);
    ok(loss.loss_time == INT64_MAX);
    ok(num_packets_lost == 1);

    quicly_loss_dispose(&loss);
}